

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O2

void core::image::float_image_normalize(Ptr *image)

{
  TypedImageBase<float> *this;
  float *pfVar1;
  invalid_argument *this_00;
  long lVar2;
  float *pfVar3;
  __shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  float local_24;
  float local_20;
  float local_1c;
  float vmin;
  float vmax;
  
  if ((image->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<float>,void>
              (local_38,&image->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
    find_min_max_value<float>((ConstPtr *)local_38,&local_20,&local_1c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    this = &((image->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_TypedImageBase<float>;
    if (local_1c <= local_20) {
      local_24 = 0.0;
      TypedImageBase<float>::fill(this,&local_24);
    }
    else {
      pfVar1 = (this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = (long)(this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pfVar1;
      if (lVar2 == 0) {
        pfVar1 = (float *)0x0;
      }
      pfVar3 = (float *)((long)pfVar1 + lVar2);
      if (lVar2 == 0) {
        pfVar3 = (float *)0x0;
      }
      for (; pfVar1 != pfVar3; pfVar1 = pfVar1 + 1) {
        *pfVar1 = (*pfVar1 - local_20) / (local_1c - local_20);
      }
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
float_image_normalize (FloatImage::Ptr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    float vmin, vmax;
    find_min_max_value<float>(image, &vmin, &vmax);
    if (vmin >= vmax)
    {
        image->fill(0.0f);
        return;
    }
    for (float* ptr = image->begin(); ptr != image->end(); ++ptr)
        *ptr = (*ptr - vmin) / (vmax - vmin);
}